

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O3

void __thiscall KDIS::KDataStream::Write<int>(KDataStream *this,int T)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  KUINT8 i;
  long lVar5;
  undefined1 auVar6 [16];
  uchar local_1d;
  int local_1c;
  
  if (this->m_MachineEndian != this->m_NetEndian) {
    auVar6 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)T
                                                                                            >> 0x18)
                                                                              << 0x30) >> 0x28),
                                                                      CONCAT14((char)((uint)T >>
                                                                                     0x10),T)) >>
                                                            0x20),T) >> 0x18),(char)((uint)T >> 8)),
                              (ushort)(byte)T) & 0xffffff00ffffff);
    auVar6 = pshuflw(auVar6,auVar6,0x1b);
    sVar1 = auVar6._0_2_;
    sVar2 = auVar6._2_2_;
    sVar3 = auVar6._4_2_;
    sVar4 = auVar6._6_2_;
    T = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar6[6] - (0xff < sVar4),
                 CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar6[4] - (0xff < sVar3),
                          CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar6[2] - (0xff < sVar2),
                                   (0 < sVar1) * (sVar1 < 0x100) * auVar6[0] - (0xff < sVar1))));
  }
  local_1c = T;
  lVar5 = 0;
  do {
    local_1d = *(uchar *)((long)&local_1c + lVar5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,&local_1d);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}